

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallSubdirectoryGenerator::GenerateScript(cmInstallSubdirectoryGenerator *this,ostream *os)

{
  cmScriptGeneratorIndent cVar1;
  ostream *poVar2;
  undefined1 local_40 [8];
  string odir;
  Indent indent;
  PolicyStatus status;
  ostream *os_local;
  cmInstallSubdirectoryGenerator *this_local;
  
  if (((((this->super_cmInstallGenerator).ExcludeFromAll & 1U) == 0) &&
      (odir.field_2._12_4_ = cmLocalGenerator::GetPolicyStatus(this->LocalGenerator,CMP0082),
      WARN < (uint)odir.field_2._12_4_)) && (odir.field_2._12_4_ - NEW < 3)) {
    cmScriptGeneratorIndent::cmScriptGeneratorIndent
              ((cmScriptGeneratorIndent *)((long)&odir.field_2 + 8));
    std::__cxx11::string::string((string *)local_40,(string *)&this->BinaryDirectory);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_40);
    poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)odir.field_2._8_4_);
    poVar2 = std::operator<<(poVar2,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n");
    cVar1 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&odir.field_2 + 8),2);
    poVar2 = ::operator<<(poVar2,cVar1);
    poVar2 = std::operator<<(poVar2,"# Include the install script for the subdirectory.\n");
    cVar1 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&odir.field_2 + 8),2);
    poVar2 = ::operator<<(poVar2,cVar1);
    poVar2 = std::operator<<(poVar2,"include(\"");
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    poVar2 = std::operator<<(poVar2,"/cmake_install.cmake\")\n");
    poVar2 = ::operator<<(poVar2,(cmScriptGeneratorIndent)odir.field_2._8_4_);
    std::operator<<(poVar2,"endif()\n\n");
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmInstallSubdirectoryGenerator::GenerateScript(std::ostream& os)
{
  if (!this->ExcludeFromAll) {
    cmPolicies::PolicyStatus status =
      this->LocalGenerator->GetPolicyStatus(cmPolicies::CMP0082);
    switch (status) {
      case cmPolicies::WARN:
      case cmPolicies::OLD:
        // OLD behavior is handled in cmLocalGenerator::GenerateInstallRules()
        break;

      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS: {
        Indent indent;
        std::string odir = this->BinaryDirectory;
        cmSystemTools::ConvertToUnixSlashes(odir);
        os << indent << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n"
           << indent.Next()
           << "# Include the install script for the subdirectory.\n"
           << indent.Next() << "include(\"" << odir
           << "/cmake_install.cmake\")\n"
           << indent << "endif()\n\n";
      } break;
    }
  }
}